

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O2

int t2_encode_packet(opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,uchar *dest,
                    int length,opj_codestream_info_t *cstr_info,int tileno)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  opj_tcd_cblk_enc_t *poVar7;
  opj_packet_info_t *poVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  opj_bio_t *bio;
  long lVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  uchar *puVar17;
  ulong uVar18;
  opj_tcd_layer_t *poVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  int *piVar23;
  uint uVar24;
  long lVar25;
  bool bVar26;
  double dVar27;
  int local_a8;
  
  iVar2 = pi->resno;
  iVar3 = pi->precno;
  iVar11 = pi->layno;
  poVar5 = tile->comps[pi->compno].resolutions;
  puVar17 = dest;
  if ((tcp->csty & 2) != 0) {
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    uVar18 = (long)tile->packno % 0x10000;
    dest[4] = (uchar)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                     0x100);
    dest[5] = (uchar)tile->packno;
    puVar17 = dest + 6;
  }
  if (iVar11 == 0) {
    for (lVar12 = 0; lVar12 < poVar5[iVar2].numbands; lVar12 = lVar12 + 1) {
      poVar6 = poVar5[iVar2].bands[lVar12].precincts;
      tgt_reset(poVar6[iVar3].incltree);
      tgt_reset(poVar6[iVar3].imsbtree);
      lVar15 = 0x30;
      for (lVar16 = 0; lVar16 < (long)poVar6[iVar3].ch * (long)poVar6[iVar3].cw; lVar16 = lVar16 + 1
          ) {
        poVar7 = poVar6[iVar3].cblks.enc;
        *(undefined4 *)((long)&poVar7->data + lVar15) = 0;
        tgt_setvalue(poVar6[iVar3].imsbtree,(OPJ_UINT32)lVar16,
                     poVar5[iVar2].bands[lVar12].numbps - *(int *)((long)poVar7 + lVar15 + -8));
        lVar15 = lVar15 + 0x40;
      }
    }
  }
  bio = bio_create();
  bio_init_enc(bio,puVar17,length);
  bio_write(bio,1,1);
  lVar15 = 0;
  lVar12 = (long)iVar11 * 0x18;
  do {
    if (poVar5[iVar2].numbands <= lVar15) {
      iVar11 = bio_flush(bio);
      if (iVar11 == 0) {
        iVar11 = bio_numbytes(bio);
        puVar17 = puVar17 + iVar11;
        bio_destroy(bio);
        if ((tcp->csty & 4) != 0) {
          puVar17[0] = 0xff;
          puVar17[1] = 0x92;
          puVar17 = puVar17 + 2;
        }
        local_a8 = (int)dest;
        if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
          cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos =
               (long)((int)puVar17 - local_a8);
        }
        for (lVar15 = 0; lVar15 < poVar5[iVar2].numbands; lVar15 = lVar15 + 1) {
          poVar6 = poVar5[iVar2].bands[lVar15].precincts;
          lVar16 = 0x30;
          for (lVar22 = 0; lVar22 < (long)poVar6[iVar3].ch * (long)poVar6[iVar3].cw;
              lVar22 = lVar22 + 1) {
            poVar7 = poVar6[iVar3].cblks.enc;
            lVar25 = *(long *)((long)poVar7 + lVar16 + -0x28);
            if (*(int *)(lVar25 + lVar12) != 0) {
              piVar23 = (int *)(lVar25 + lVar12);
              if (dest + length < puVar17 + (uint)piVar23[1]) goto LAB_00136b3c;
              memcpy(puVar17,*(void **)(piVar23 + 4),(ulong)(uint)piVar23[1]);
              piVar1 = (int *)((long)&poVar7->data + lVar16);
              *piVar1 = *piVar1 + *piVar23;
              puVar17 = puVar17 + (uint)piVar23[1];
              if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                poVar8 = cstr_info->tile[tileno].packet;
                dVar27 = poVar8[cstr_info->packno].disto + *(double *)(piVar23 + 2);
                poVar8[cstr_info->packno].disto = dVar27;
                if (cstr_info->D_max <= dVar27 && dVar27 != cstr_info->D_max) {
                  cstr_info->D_max = dVar27;
                }
              }
            }
            lVar16 = lVar16 + 0x40;
          }
        }
        local_a8 = (int)puVar17 - local_a8;
      }
      else {
        bio_destroy(bio);
LAB_00136b3c:
        local_a8 = -999;
      }
      return local_a8;
    }
    poVar6 = poVar5[iVar2].bands[lVar15].precincts;
    lVar16 = 0x30;
    lVar22 = 0;
    while( true ) {
      iVar9 = poVar6[iVar3].cw;
      iVar13 = poVar6[iVar3].ch;
      if (iVar13 * iVar9 <= lVar22) break;
      if ((*(int *)((long)&(poVar6[iVar3].cblks.enc)->data + lVar16) == 0) &&
         (*(int *)(*(long *)((long)poVar6[iVar3].cblks.enc + lVar16 + -0x28) + lVar12) != 0)) {
        tgt_setvalue(poVar6[iVar3].incltree,(OPJ_UINT32)lVar22,iVar11);
      }
      lVar22 = lVar22 + 1;
      lVar16 = lVar16 + 0x40;
    }
    for (lVar16 = 0; lVar16 < iVar13 * iVar9; lVar16 = lVar16 + 1) {
      poVar7 = poVar6[iVar3].cblks.enc;
      poVar19 = poVar7[lVar16].layers + iVar11;
      if (poVar7[lVar16].numpasses == 0) {
        tgt_encode(bio,poVar6[iVar3].incltree,(OPJ_UINT32)lVar16,iVar11 + 1);
      }
      else {
        bio_write(bio,(uint)(poVar19->numpasses != 0),1);
      }
      uVar14 = poVar19->numpasses;
      if (uVar14 != 0) {
        if (poVar7[lVar16].numpasses == 0) {
          poVar7[lVar16].numlenbits = 3;
          tgt_encode(bio,poVar6[iVar3].imsbtree,(OPJ_UINT32)lVar16,999);
          uVar14 = poVar19->numpasses;
        }
        iVar9 = 1;
        if (uVar14 == 2) {
          iVar9 = 2;
          uVar14 = 2;
LAB_001369a1:
          bio_write(bio,uVar14,iVar9);
        }
        else {
          if (uVar14 == 1) {
            uVar14 = 0;
            goto LAB_001369a1;
          }
          if ((int)uVar14 < 6) {
            uVar14 = uVar14 - 3 | 0xc;
            iVar9 = 4;
            goto LAB_001369a1;
          }
          if (uVar14 < 0x25) {
            uVar14 = uVar14 - 6 | 0x1e0;
            iVar9 = 9;
            goto LAB_001369a1;
          }
          if (uVar14 < 0xa5) {
            uVar14 = uVar14 - 0x25 | 0xff80;
            iVar9 = 0x10;
            goto LAB_001369a1;
          }
        }
        iVar9 = poVar7[lVar16].numpasses;
        uVar18 = (ulong)iVar9;
        OVar4 = poVar19->numpasses;
        lVar22 = (long)(int)(OVar4 + iVar9 + -1) - uVar18;
        lVar25 = uVar18 * 0x18 + 0x14;
        iVar20 = 0;
        iVar21 = 0;
        iVar13 = 0;
        for (; iVar10 = iVar13, (uint)uVar18 < OVar4 + iVar9; uVar18 = (ulong)((uint)uVar18 + 1)) {
          iVar21 = iVar21 + 1;
          iVar20 = iVar20 + *(int *)((long)&(poVar7[lVar16].passes)->rate + lVar25);
          bVar26 = lVar22 == 0;
          lVar22 = lVar22 + -1;
          if ((bVar26) || (*(int *)((long)poVar7[lVar16].passes + lVar25 + -4) != 0)) {
            iVar10 = int_floorlog2(iVar20);
            iVar20 = poVar7[lVar16].numlenbits;
            iVar21 = int_floorlog2(iVar21);
            iVar20 = (iVar10 - (iVar21 + iVar20)) + 1;
            if (iVar13 <= iVar20) {
              iVar13 = iVar20;
            }
            iVar20 = 0;
            iVar21 = 0;
          }
          lVar25 = lVar25 + 0x18;
        }
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          bio_write(bio,1,1);
        }
        bio_write(bio,0,1);
        poVar7[lVar16].numlenbits = poVar7[lVar16].numlenbits + iVar13;
        iVar9 = poVar7[lVar16].numpasses;
        uVar18 = (ulong)iVar9;
        lVar22 = uVar18 * 0x18 + 0x14;
        while( true ) {
          uVar14 = poVar19->numpasses + iVar9;
          uVar24 = (uint)uVar18;
          if (uVar14 <= uVar24) break;
          iVar21 = iVar21 + 1;
          iVar20 = iVar20 + *(int *)((long)&(poVar7[lVar16].passes)->rate + lVar22);
          if ((uVar24 == uVar14 - 1) || (*(int *)((long)poVar7[lVar16].passes + lVar22 + -4) != 0))
          {
            iVar9 = poVar7[lVar16].numlenbits;
            iVar13 = int_floorlog2(iVar21);
            bio_write(bio,iVar20,iVar9 + iVar13);
            iVar9 = poVar7[lVar16].numpasses;
            iVar20 = 0;
            iVar21 = 0;
          }
          lVar22 = lVar22 + 0x18;
          uVar18 = (ulong)(uVar24 + 1);
        }
      }
      iVar9 = poVar6[iVar3].cw;
      iVar13 = poVar6[iVar3].ch;
    }
    lVar15 = lVar15 + 1;
  } while( true );
}

Assistant:

static int t2_encode_packet(opj_tcd_tile_t * tile, opj_tcp_t * tcp, opj_pi_iterator_t *pi, unsigned char *dest, int length, opj_codestream_info_t *cstr_info, int tileno) {
	int bandno, cblkno;
	unsigned char *c = dest;

	int compno = pi->compno;	/* component value */
	int resno  = pi->resno;		/* resolution level value */
	int precno = pi->precno;	/* precinct value */
	int layno  = pi->layno;		/* quality layer value */

	opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
	opj_tcd_resolution_t *res = &tilec->resolutions[resno];
	
	opj_bio_t *bio = NULL;	/* BIO component */
	
	/* <SOP 0xff91> */
	if (tcp->csty & J2K_CP_CSTY_SOP) {
		c[0] = 255;
		c[1] = 145;
		c[2] = 0;
		c[3] = 4;
		c[4] = (unsigned char)((tile->packno % 65536) / 256);
		c[5] = (unsigned char)((tile->packno % 65536) % 256);
		c += 6;
	}
	/* </SOP> */
	
	if (!layno) {
		for (bandno = 0; bandno < res->numbands; bandno++) {
			opj_tcd_band_t *band = &res->bands[bandno];
			opj_tcd_precinct_t *prc = &band->precincts[precno];
			tgt_reset(prc->incltree);
			tgt_reset(prc->imsbtree);
			for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
				opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
				cblk->numpasses = 0;
				tgt_setvalue(prc->imsbtree, cblkno, band->numbps - cblk->numbps);
			}
		}
	}
	
	bio = bio_create();
	bio_init_enc(bio, c, length);
	bio_write(bio, 1, 1);		/* Empty header bit */
	
	/* Writing Packet header */
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!cblk->numpasses && layer->numpasses) {
				tgt_setvalue(prc->incltree, cblkno, layno);
			}
		}
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			int increment = 0;
			int nump = 0;
			int len = 0, passno;
			/* cblk inclusion bits */
			if (!cblk->numpasses) {
				tgt_encode(bio, prc->incltree, cblkno, layno + 1);
			} else {
				bio_write(bio, layer->numpasses != 0, 1);
			}
			/* if cblk not included, go to the next cblk  */
			if (!layer->numpasses) {
				continue;
			}
			/* if first instance of cblk --> zero bit-planes information */
			if (!cblk->numpasses) {
				cblk->numlenbits = 3;
				tgt_encode(bio, prc->imsbtree, cblkno, 999);
			}
			/* number of coding passes included */
			t2_putnumpasses(bio, layer->numpasses);
			
			/* computation of the increase of the length indicator and insertion in the header     */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					increment = int_max(increment, int_floorlog2(len) + 1 - (cblk->numlenbits + int_floorlog2(nump)));
					len = 0;
					nump = 0;
				}
			}
			t2_putcommacode(bio, increment);

			/* computation of the new Length indicator */
			cblk->numlenbits += increment;

			/* insertion of the codeword segment length */
			for (passno = cblk->numpasses; passno < cblk->numpasses + layer->numpasses; passno++) {
				opj_tcd_pass_t *pass = &cblk->passes[passno];
				nump++;
				len += pass->len;
				if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
					bio_write(bio, len, cblk->numlenbits + int_floorlog2(nump));
					len = 0;
					nump = 0;
				}
			}
		}
	}

	if (bio_flush(bio)) {
		bio_destroy(bio);
		return -999;		/* modified to eliminate longjmp !! */
	}

	c += bio_numbytes(bio);
	bio_destroy(bio);
	
	/* <EPH 0xff92> */
	if (tcp->csty & J2K_CP_CSTY_EPH) {
		c[0] = 255;
		c[1] = 146;
		c += 2;
	}
	/* </EPH> */

	/* << INDEX */
	/* End of packet header position. Currently only represents the distance to start of packet
	// Will be updated later by incrementing with packet start value */
	if(cstr_info && cstr_info->index_write) {
		opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
		info_PK->end_ph_pos = (int)(c - dest);
	}
	/* INDEX >> */
	
	/* Writing the packet body */
	
	for (bandno = 0; bandno < res->numbands; bandno++) {
		opj_tcd_band_t *band = &res->bands[bandno];
		opj_tcd_precinct_t *prc = &band->precincts[precno];
		for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
			opj_tcd_cblk_enc_t* cblk = &prc->cblks.enc[cblkno];
			opj_tcd_layer_t *layer = &cblk->layers[layno];
			if (!layer->numpasses) {
				continue;
			}
			if (c + layer->len > dest + length) {
				return -999;
			}
			
			memcpy(c, layer->data, layer->len);
			cblk->numpasses += layer->numpasses;
			c += layer->len;
			/* << INDEX */ 
			if(cstr_info && cstr_info->index_write) {
				opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
				info_PK->disto += layer->disto;
				if (cstr_info->D_max < info_PK->disto) {
					cstr_info->D_max = info_PK->disto;
				}
			}
			/* INDEX >> */
		}
	}
	
	return (c - dest);
}